

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

ErrState * findErrorForCurrentThread(void)

{
  void *pvVar1;
  __PHYSFS_ERRSTATETYPE__ *p_Var2;
  
  if (errorLock != (void *)0x0) {
    __PHYSFS_platformGrabMutex(errorLock);
  }
  if (errorStates != (ErrState *)0x0) {
    pvVar1 = __PHYSFS_platformGetThreadID();
    for (p_Var2 = errorStates; p_Var2 != (ErrState *)0x0; p_Var2 = p_Var2->next) {
      if (p_Var2->tid == pvVar1) goto LAB_001069cf;
    }
  }
  p_Var2 = (ErrState *)0x0;
LAB_001069cf:
  if (errorLock != (void *)0x0) {
    __PHYSFS_platformReleaseMutex(errorLock);
  }
  return p_Var2;
}

Assistant:

static ErrState *findErrorForCurrentThread(void)
{
    ErrState *i;
    void *tid;

    if (errorLock != NULL)
        __PHYSFS_platformGrabMutex(errorLock);

    if (errorStates != NULL)
    {
        tid = __PHYSFS_platformGetThreadID();

        for (i = errorStates; i != NULL; i = i->next)
        {
            if (i->tid == tid)
            {
                if (errorLock != NULL)
                    __PHYSFS_platformReleaseMutex(errorLock);
                return i;
            } /* if */
        } /* for */
    } /* if */

    if (errorLock != NULL)
        __PHYSFS_platformReleaseMutex(errorLock);

    return NULL;   /* no error available. */
}